

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O0

curl_socket_t sockit(curl_socket_t fd)

{
  byte bVar1;
  bool bVar2;
  uchar uVar3;
  int iVar4;
  ssize_t sVar5;
  ulong uVar6;
  size_t sVar7;
  uchar *portp;
  curl_socket_t cStack_258;
  _Bool login;
  uchar plen;
  uchar ulen;
  unsigned_short s5port;
  curl_socket_t connfd;
  unsigned_short socksport;
  uchar *address;
  uchar rep;
  uchar type;
  ssize_t sStack_240;
  uchar len;
  ssize_t rc;
  uchar response [272];
  uchar buffer [272];
  curl_socket_t local_c;
  curl_socket_t fd_local;
  
  cStack_258 = -1;
  getconfig();
  sVar5 = recv(fd,response + 0x108,0x110,0);
  logmsg("READ %d bytes",sVar5);
  loghex(response + 0x108,sVar5);
  if (response[0x108] == '\x04') {
    local_c = socks4(fd,response + 0x108,sVar5);
  }
  else if (response[0x108] == config.version) {
    if ((response[0x109] < config.nmethods_min) || (config.nmethods_max < response[0x109])) {
      logmsg("NMETHODS byte not within %d - %d ",(ulong)config.nmethods_min,
             (ulong)config.nmethods_max);
      local_c = -1;
    }
    else if (sVar5 == (int)(response[0x109] + 2)) {
      logmsg("Incoming request deemed fine!");
      rc._0_1_ = config.responseversion;
      rc._1_1_ = config.responsemethod;
      sVar5 = send(fd,&rc,2,0);
      if (sVar5 == 2) {
        logmsg("Sent %d bytes",2);
        loghex((uchar *)&rc,2);
        sStack_240 = recv(fd,response + 0x108,0x110,0);
        logmsg("READ %d bytes",sStack_240);
        loghex(response + 0x108,sStack_240);
        uVar3 = response[0x109];
        if (config.responsemethod == '\x02') {
          bVar2 = true;
          if (sStack_240 < 5) {
            logmsg("Too short auth input: %d",sStack_240);
            return -1;
          }
          if (response[0x108] != '\x01') {
            logmsg("Auth VERSION byte not 1, got %d",(ulong)response[0x108]);
            return -1;
          }
          if (sStack_240 < (int)(response[0x109] + 4)) {
            logmsg("Too short packet for username: %d",sStack_240);
            return -1;
          }
          bVar1 = response[(long)(int)(response[0x109] + 2) + 0x108];
          if (sStack_240 < (int)(response[0x109] + 3 + (uint)bVar1)) {
            logmsg("Too short packet for ulen %d plen %d: %d",(ulong)response[0x109],(ulong)bVar1,
                   sStack_240);
            return -1;
          }
          uVar6 = (ulong)response[0x109];
          sVar7 = strlen(config.user);
          if ((((uVar6 != sVar7) || (sVar7 = strlen(config.password), bVar1 != sVar7)) ||
              (iVar4 = memcmp(response + 0x10a,config.user,(ulong)uVar3), iVar4 != 0)) ||
             (iVar4 = memcmp(response + (long)(int)(uVar3 + 3) + 0x108,config.password,(ulong)bVar1)
             , iVar4 != 0)) {
            logmsg("mismatched credentials!");
            bVar2 = false;
          }
          rc._0_1_ = '\x01';
          rc._1_1_ = !bVar2;
          sVar5 = send(fd,&rc,2,0);
          if (sVar5 != 2) {
            logmsg("Sending auth response failed!");
            return -1;
          }
          logmsg("Sent %d bytes",2);
          loghex((uchar *)&rc,2);
          if (!bVar2) {
            return -1;
          }
          sStack_240 = recv(fd,response + 0x108,0x110,0);
          logmsg("READ %d bytes",sStack_240);
          loghex(response + 0x108,sStack_240);
        }
        if (sStack_240 < 6) {
          logmsg("Too short for request: %d",sStack_240);
          local_c = -1;
        }
        else if (response[0x108] == config.version) {
          if (response[0x109] == config.reqcmd) {
            if (response[0x10a] == '\0') {
              if (response[0x10b] == '\x01') {
                address._7_1_ = 4;
              }
              else if (response[0x10b] == '\x03') {
                address._7_1_ = response[0x10c] + 1;
              }
              else {
                if (response[0x10b] != '\x04') {
                  logmsg("Unknown ATYP %d",(ulong)response[0x10b]);
                  return -1;
                }
                address._7_1_ = 0x10;
              }
              if (sStack_240 < (int)(address._7_1_ + 6)) {
                logmsg("Request too short: %d, expected %d",sStack_240,(ulong)(address._7_1_ + 6));
                local_c = -1;
              }
              else {
                if (config.port == 0) {
                  portp._6_2_ = CONCAT11(response[(long)(int)(address._7_1_ + 4) + 0x108],
                                         response[(long)(int)(address._7_1_ + 4) + 0x109]);
                }
                else {
                  portp._6_2_ = config.port;
                }
                if (config.connectrep == '\0') {
                  cStack_258 = socksconnect(portp._6_2_,config.addr);
                }
                if (cStack_258 == -1) {
                  address._5_1_ = '\x01';
                }
                else {
                  address._5_1_ = config.connectrep;
                }
                rc._0_1_ = config.responseversion;
                rc._1_1_ = address._5_1_;
                rc._2_1_ = 0;
                rc._3_1_ = response[0x10b];
                memcpy((void *)((long)&rc + 4),response + 0x10c,(ulong)address._7_1_);
                *(undefined2 *)(response + (long)(int)(address._7_1_ + 4) + -8) =
                     *(undefined2 *)(response + (long)(int)(address._7_1_ + 4) + 0x108);
                sVar5 = send(fd,&rc,(long)(int)(address._7_1_ + 6),0);
                if (sVar5 == (int)(address._7_1_ + 6)) {
                  logmsg("Sent %d bytes",sVar5);
                  loghex((uchar *)&rc,sVar5);
                  if (address._5_1_ == '\0') {
                    local_c = cStack_258;
                  }
                  else {
                    if (cStack_258 != -1) {
                      close(cStack_258);
                    }
                    local_c = -1;
                  }
                }
                else {
                  logmsg("Sending connect response failed!");
                  local_c = -1;
                }
              }
            }
            else {
              logmsg("Request COMMAND byte not %d",(ulong)config.reqcmd);
              local_c = -1;
            }
          }
          else {
            logmsg("Request COMMAND byte not %d",(ulong)config.reqcmd);
            local_c = -1;
          }
        }
        else {
          logmsg("Request VERSION byte not %d",(ulong)config.version);
          local_c = -1;
        }
      }
      else {
        logmsg("Sending response failed!");
        local_c = -1;
      }
    }
    else {
      logmsg("Expected %d bytes, got %d",(ulong)(response[0x109] + 2),sVar5);
      local_c = -1;
    }
  }
  else {
    logmsg("VERSION byte not %d",(ulong)config.version);
    local_c = -1;
  }
  return local_c;
}

Assistant:

static curl_socket_t sockit(curl_socket_t fd)
{
  unsigned char buffer[256 + 16];
  unsigned char response[256 + 16];
  ssize_t rc;
  unsigned char len;
  unsigned char type;
  unsigned char rep = 0;
  unsigned char *address;
  unsigned short socksport;
  curl_socket_t connfd = CURL_SOCKET_BAD;
  unsigned short s5port;

  getconfig();

  rc = recv(fd, (char *)buffer, sizeof(buffer), 0);

  logmsg("READ %d bytes", rc);
  loghex(buffer, rc);

  if(buffer[SOCKS5_VERSION] == 4)
    return socks4(fd, buffer, rc);

  if(buffer[SOCKS5_VERSION] != config.version) {
    logmsg("VERSION byte not %d", config.version);
    return CURL_SOCKET_BAD;
  }
  if((buffer[SOCKS5_NMETHODS] < config.nmethods_min) ||
     (buffer[SOCKS5_NMETHODS] > config.nmethods_max)) {
    logmsg("NMETHODS byte not within %d - %d ",
           config.nmethods_min, config.nmethods_max);
    return CURL_SOCKET_BAD;
  }
  /* after NMETHODS follows that many bytes listing the methods the client
     says it supports */
  if(rc != (buffer[SOCKS5_NMETHODS] + 2)) {
    logmsg("Expected %d bytes, got %d", buffer[SOCKS5_NMETHODS] + 2, rc);
    return CURL_SOCKET_BAD;
  }
  logmsg("Incoming request deemed fine!");

  /* respond with two bytes: VERSION + METHOD */
  response[0] = config.responseversion;
  response[1] = config.responsemethod;
  rc = (send)(fd, (char *)response, 2, 0);
  if(rc != 2) {
    logmsg("Sending response failed!");
    return CURL_SOCKET_BAD;
  }
  logmsg("Sent %d bytes", rc);
  loghex(response, rc);

  /* expect the request or auth */
  rc = recv(fd, (char *)buffer, sizeof(buffer), 0);

  logmsg("READ %d bytes", rc);
  loghex(buffer, rc);

  if(config.responsemethod == 2) {
    /* RFC 1929 authentication
       +----+------+----------+------+----------+
       |VER | ULEN |  UNAME   | PLEN |  PASSWD  |
       +----+------+----------+------+----------+
       | 1  |  1   | 1 to 255 |  1   | 1 to 255 |
       +----+------+----------+------+----------+
    */
    unsigned char ulen;
    unsigned char plen;
    bool login = TRUE;
    if(rc < 5) {
      logmsg("Too short auth input: %d", rc);
      return CURL_SOCKET_BAD;
    }
    if(buffer[SOCKS5_VERSION] != 1) {
      logmsg("Auth VERSION byte not 1, got %d", buffer[SOCKS5_VERSION]);
      return CURL_SOCKET_BAD;
    }
    ulen = buffer[SOCKS5_ULEN];
    if(rc < 4 + ulen) {
      logmsg("Too short packet for username: %d", rc);
      return CURL_SOCKET_BAD;
    }
    plen = buffer[SOCKS5_ULEN + ulen + 1];
    if(rc < 3 + ulen + plen) {
      logmsg("Too short packet for ulen %d plen %d: %d", ulen, plen, rc);
      return CURL_SOCKET_BAD;
    }
    if((ulen != strlen(config.user)) ||
       (plen != strlen(config.password)) ||
       memcmp(&buffer[SOCKS5_UNAME], config.user, ulen) ||
       memcmp(&buffer[SOCKS5_UNAME + ulen + 1], config.password, plen)) {
      /* no match! */
      logmsg("mismatched credentials!");
      login = FALSE;
    }
    response[0] = 1;
    response[1] = login ? 0 : 1;
    rc = (send)(fd, (char *)response, 2, 0);
    if(rc != 2) {
      logmsg("Sending auth response failed!");
      return CURL_SOCKET_BAD;
    }
    logmsg("Sent %d bytes", rc);
    loghex(response, rc);
    if(!login)
      return CURL_SOCKET_BAD;

    /* expect the request */
    rc = recv(fd, (char *)buffer, sizeof(buffer), 0);

    logmsg("READ %d bytes", rc);
    loghex(buffer, rc);
  }
  if(rc < 6) {
    logmsg("Too short for request: %d", rc);
    return CURL_SOCKET_BAD;
  }

  if(buffer[SOCKS5_VERSION] != config.version) {
    logmsg("Request VERSION byte not %d", config.version);
    return CURL_SOCKET_BAD;
  }
  /* 1 == CONNECT */
  if(buffer[SOCKS5_REQCMD] != config.reqcmd) {
    logmsg("Request COMMAND byte not %d", config.reqcmd);
    return CURL_SOCKET_BAD;
  }
  /* reserved, should be zero */
  if(buffer[SOCKS5_RESERVED] != 0) {
    logmsg("Request COMMAND byte not %d", config.reqcmd);
    return CURL_SOCKET_BAD;
  }
  /* ATYP:
     o  IP V4 address: X'01'
     o  DOMAINNAME: X'03'
     o  IP V6 address: X'04'
  */
  type = buffer[SOCKS5_ATYP];
  address = &buffer[SOCKS5_DSTADDR];
  switch(type) {
  case 1:
    /* 4 bytes IPv4 address */
    len = 4;
    break;
  case 3:
    /* The first octet of the address field contains the number of octets of
       name that follow */
    len = buffer[SOCKS5_DSTADDR];
    len++;
    break;
  case 4:
    /* 16 bytes IPv6 address */
    len = 16;
    break;
  default:
    logmsg("Unknown ATYP %d", type);
    return CURL_SOCKET_BAD;
  }
  if(rc < (4 + len + 2)) {
    logmsg("Request too short: %d, expected %d", rc, 4 + len + 2);
    return CURL_SOCKET_BAD;
  }

  if(!config.port) {
    unsigned char *portp = &buffer[SOCKS5_DSTADDR + len];
    s5port = (unsigned short)((portp[0]<<8) | (portp[1]));
  }
  else
    s5port = config.port;

  if(!config.connectrep)
    connfd = socksconnect(s5port, config.addr);

  if(connfd == CURL_SOCKET_BAD) {
    /* failed */
    rep = 1;
  }
  else {
    rep = config.connectrep;
  }

  /* */
  response[SOCKS5_VERSION] = config.responseversion;

  /*
    o  REP    Reply field:
    o  X'00' succeeded
    o  X'01' general SOCKS server failure
    o  X'02' connection not allowed by ruleset
    o  X'03' Network unreachable
    o  X'04' Host unreachable
    o  X'05' Connection refused
    o  X'06' TTL expired
    o  X'07' Command not supported
    o  X'08' Address type not supported
    o  X'09' to X'FF' unassigned
  */
  response[SOCKS5_REP] = rep;
  response[SOCKS5_RESERVED] = 0; /* must be zero */
  response[SOCKS5_ATYP] = type; /* address type */

  /* mirror back the original addr + port */

  /* address or hostname */
  memcpy(&response[SOCKS5_BNDADDR], address, len);

  /* port number */
  memcpy(&response[SOCKS5_BNDADDR + len],
         &buffer[SOCKS5_DSTADDR + len], sizeof(socksport));

  rc = (send)(fd, (char *)response, len + 6, 0);
  if(rc != (len + 6)) {
    logmsg("Sending connect response failed!");
    return CURL_SOCKET_BAD;
  }
  logmsg("Sent %d bytes", rc);
  loghex(response, rc);

  if(!rep)
    return connfd;

  if(connfd != CURL_SOCKET_BAD)
    sclose(connfd);

  return CURL_SOCKET_BAD;
}